

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KryoFlux.cpp
# Opt level: O0

void __thiscall KryoFlux::UploadFirmware(KryoFlux *this)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  posix_error *this_00;
  int *piVar4;
  char *message;
  size_type sVar5;
  uchar *puVar6;
  exception *this_01;
  istreambuf_iterator<char,_std::char_traits<char>_> __first;
  istreambuf_iterator<char,_std::char_traits<char>_> __last;
  allocator<char> local_439;
  string local_438;
  string local_418;
  allocator<unsigned_char> local_3f1;
  undefined1 local_3f0 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> fwverify;
  string local_3d0;
  string local_3b0;
  int local_390;
  allocator<char> local_389;
  int offset;
  string local_368;
  uint local_348;
  allocator<unsigned_char> local_341;
  int fwsize;
  undefined4 local_338;
  undefined1 local_330 [12];
  undefined1 local_320 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> fwdata;
  ifstream fwfile;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  undefined1 local_e0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> fwpath;
  string local_b8;
  allocator<char> local_91;
  string local_90;
  allocator<char> local_69;
  string local_68;
  allocator<char> local_31;
  string local_30;
  KryoFlux *local_10;
  KryoFlux *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"T#",&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,">",&local_69);
  SamBaCommand(this,&local_30,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator(&local_69);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"N#",&local_91);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b8,"\n\r",(allocator<char> *)(fwpath.field_2._M_local_buf + 0xf));
  SamBaCommand(this,&local_90,&local_b8);
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator((allocator<char> *)(fwpath.field_2._M_local_buf + 0xf));
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator(&local_91);
  util::resource_dir_abi_cxx11_();
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0,
                 &local_100,KF_FW_FILE);
  std::__cxx11::string::~string((string *)&local_100);
  std::ifstream::ifstream
            (&fwdata.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,(string *)local_e0,_S_bin);
  bVar1 = std::ios::operator!((ios *)((long)&fwdata.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage +
                                     *(long *)(fwdata.
                                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                               ._M_impl.super__Vector_impl_data._M_end_of_storage +
                                              -0x18)));
  if ((bVar1 & 1) != 0) {
    this_00 = (posix_error *)__cxa_allocate_exception(0x20);
    piVar4 = __errno_location();
    iVar3 = *piVar4;
    message = (char *)std::__cxx11::string::c_str();
    posix_error::posix_error(this_00,iVar3,message);
    __cxa_throw(this_00,&posix_error::typeinfo,posix_error::~posix_error);
  }
  std::istreambuf_iterator<char,_std::char_traits<char>_>::istreambuf_iterator
            ((istreambuf_iterator<char,_std::char_traits<char>_> *)local_330,
             (istream_type *)
             &fwdata.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::istreambuf_iterator<char,_std::char_traits<char>_>::istreambuf_iterator
            ((istreambuf_iterator<char,_std::char_traits<char>_> *)&fwsize);
  std::allocator<unsigned_char>::allocator(&local_341);
  __first._12_4_ = 0;
  __first._M_sbuf = (streambuf_type *)local_330._0_8_;
  __first._M_c = local_330._8_4_;
  __last._12_4_ = 0;
  __last._M_sbuf = (streambuf_type *)_fwsize;
  __last._M_c = local_338;
  std::vector<unsigned_char,std::allocator<unsigned_char>>::
  vector<std::istreambuf_iterator<char,std::char_traits<char>>,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_320,__first,__last,
             &local_341);
  std::allocator<unsigned_char>::~allocator(&local_341);
  sVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_320);
  local_348 = (uint)sVar5;
  util::fmt_abi_cxx11_(&local_368,"S%08lx,%08lx#",0x202000,sVar5 & 0xffffffff);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&offset,"",&local_389);
  SamBaCommand(this,&local_368,(string *)&offset);
  std::__cxx11::string::~string((string *)&offset);
  std::allocator<char>::~allocator(&local_389);
  std::__cxx11::string::~string((string *)&local_368);
  for (local_390 = 0; local_390 < (int)local_348; local_390 = iVar3 + local_390) {
    puVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_320);
    iVar3 = (**(code **)(*(long *)this + 0x28))(this,puVar6 + local_390,local_348 - local_390);
  }
  util::fmt_abi_cxx11_(&local_3b0,"R%08lx,%08lx#",0x202000,(ulong)local_348);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3d0,"",
             (allocator<char> *)
             ((long)&fwverify.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  SamBaCommand(this,&local_3b0,&local_3d0);
  std::__cxx11::string::~string((string *)&local_3d0);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&fwverify.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::__cxx11::string::~string((string *)&local_3b0);
  sVar5 = (size_type)(int)local_348;
  std::allocator<unsigned_char>::allocator(&local_3f1);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_3f0,sVar5,&local_3f1);
  std::allocator<unsigned_char>::~allocator(&local_3f1);
  for (local_390 = 0; local_390 < (int)local_348; local_390 = iVar3 + local_390) {
    puVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_3f0);
    iVar3 = (**(code **)(*(long *)this + 0x20))(this,puVar6 + local_390,local_348 - local_390);
  }
  bVar2 = std::operator!=((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_320,
                          (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_3f0);
  if (!bVar2) {
    util::fmt_abi_cxx11_(&local_418,"G%08lx#",0x202000);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_438,"",&local_439);
    SamBaCommand(this,&local_418,&local_438);
    std::__cxx11::string::~string((string *)&local_438);
    std::allocator<char>::~allocator(&local_439);
    std::__cxx11::string::~string((string *)&local_418);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_3f0);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_320);
    std::ifstream::~ifstream
              (&fwdata.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    std::__cxx11::string::~string((string *)local_e0);
    return;
  }
  this_01 = (exception *)__cxa_allocate_exception(0x10);
  util::exception::exception<char_const(&)[29]>
            (this_01,(char (*) [29])"firmware verification failed");
  __cxa_throw(this_01,&util::exception::typeinfo,util::exception::~exception);
}

Assistant:

void KryoFlux::UploadFirmware()
{
    // Set interactive then non-interactive mode, to check for boot responses
    // https://sourceforge.net/p/lejos/wiki-nxt/SAM-BA%20Protocol/
    SamBaCommand("T#", ">");
    SamBaCommand("N#", "\n\r");

    auto fwpath = util::resource_dir() + KF_FW_FILE;
    std::ifstream fwfile(fwpath, std::ios::binary);
    if (!fwfile)
        throw posix_error(errno, fwpath.c_str());

    auto fwdata = std::vector<uint8_t>(std::istreambuf_iterator<char>(fwfile),
        std::istreambuf_iterator<char>());
    auto fwsize = static_cast<int>(fwdata.size());

    SamBaCommand(util::fmt("S%08lx,%08lx#", KF_FW_LOAD_ADDR, fwsize));

    auto offset = 0;
    while (offset < fwsize)
        offset += Write(fwdata.data() + offset, fwsize - offset);

    SamBaCommand(util::fmt("R%08lx,%08lx#", KF_FW_LOAD_ADDR, fwsize));

    std::vector<uint8_t> fwverify(fwsize);
    for (offset = 0; offset < fwsize; )
        offset += Read(fwverify.data() + offset, fwsize - offset);

    if (fwdata != fwverify)
        throw util::exception("firmware verification failed");

    SamBaCommand(util::fmt("G%08lx#", KF_FW_EXEC_ADDR));
}